

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemtrayicon_x11.cpp
# Opt level: O0

void __thiscall QSystemTrayIconPrivate::install_sys(QSystemTrayIconPrivate *this)

{
  QWidget *this_00;
  QSystemTrayWatcher *pQVar1;
  unsigned_long uVar2;
  QSystemTrayIconSys *pQVar3;
  QSystemTrayIconPrivate *in_RDI;
  QSystemTrayIcon *q;
  QSystemTrayIcon *in_stack_00000028;
  QSystemTrayIconSys *in_stack_00000030;
  
  this_00 = (QWidget *)q_func(in_RDI);
  if (in_RDI->qpa_sys == (QPlatformSystemTrayIcon *)0x0) {
    if (in_RDI->sys == (QSystemTrayIconSys *)0x0) {
      if (in_RDI->trayWatcher == (QSystemTrayWatcher *)0x0) {
        pQVar1 = (QSystemTrayWatcher *)operator_new(0x18);
        QSystemTrayWatcher::QSystemTrayWatcher
                  ((QSystemTrayWatcher *)this_00,(QSystemTrayIcon *)in_RDI);
        in_RDI->trayWatcher = pQVar1;
      }
      uVar2 = locateSystemTray();
      if (uVar2 != 0) {
        pQVar3 = (QSystemTrayIconSys *)operator_new(0x30);
        QSystemTrayIconSys::QSystemTrayIconSys(in_stack_00000030,in_stack_00000028);
        in_RDI->sys = pQVar3;
        QWidget::show(this_00);
      }
    }
  }
  else {
    install_sys_qpa((QSystemTrayIconPrivate *)q);
  }
  return;
}

Assistant:

void QSystemTrayIconPrivate::install_sys()
{
    Q_Q(QSystemTrayIcon);

    if (qpa_sys) {
        install_sys_qpa();
        return;
    }

    if (!sys) {
        if (!trayWatcher)
            trayWatcher = new QSystemTrayWatcher(q);

        if (locateSystemTray()) {
            sys = new QSystemTrayIconSys(q);
            sys->show();
        }
    }
}